

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::SetColumnOffset(int column_index,float offset)

{
  int iVar1;
  ImGuiOldColumns *pIVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  ImGuiContext *pIVar5;
  uint uVar6;
  ImGuiOldColumnData *pIVar7;
  uint uVar8;
  ImGuiOldColumnData *pIVar9;
  undefined1 in_register_00001204 [60];
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  pIVar5 = GImGui;
  auVar10._4_60_ = in_register_00001204;
  auVar10._0_4_ = offset;
  pIVar2 = (GImGui->CurrentWindow->DC).CurrentColumns;
  if (pIVar2 == (ImGuiOldColumns *)0x0) {
    __assert_fail("columns != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0xe32,"void ImGui::SetColumnOffset(int, float)");
  }
  iVar1 = (pIVar2->Columns).Size;
  while( true ) {
    if (column_index < 0) {
      column_index = pIVar2->Current;
    }
    if (iVar1 <= column_index) {
      __assert_fail("column_index < columns->Columns.Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                    ,0xe36,"void ImGui::SetColumnOffset(int, float)");
    }
    auVar11 = ZEXT816(0) << 0x40;
    if (((pIVar2->Flags & 4U) == 0) && (column_index < pIVar2->Count + -1)) {
      uVar6 = column_index;
      if (column_index < 0) {
        uVar6 = pIVar2->Current;
      }
      uVar8 = uVar6 + 1;
      if (pIVar2->IsBeingResized == false) {
        if ((iVar1 <= (int)uVar8 || (int)uVar6 < -1) || ((int)uVar6 < 0)) break;
        pIVar7 = (pIVar2->Columns).Data;
        pIVar9 = pIVar7 + uVar8;
        pIVar7 = pIVar7 + uVar6;
      }
      else {
        if ((iVar1 <= (int)uVar8 || (int)uVar6 < -1) || ((int)uVar6 < 0)) break;
        pIVar7 = (pIVar2->Columns).Data;
        pIVar9 = (ImGuiOldColumnData *)&pIVar7[uVar8].OffsetNormBeforeResize;
        pIVar7 = (ImGuiOldColumnData *)&pIVar7[uVar6].OffsetNormBeforeResize;
      }
      auVar11 = ZEXT416((uint)((pIVar9->OffsetNorm - pIVar7->OffsetNorm) *
                              (pIVar2->OffMaxX - pIVar2->OffMinX)));
      bVar4 = true;
    }
    else {
      bVar4 = false;
    }
    if ((pIVar2->Flags & 8U) == 0) {
      auVar3 = vminss_avx(auVar10._0_16_,
                          ZEXT416((uint)(pIVar2->OffMaxX -
                                        (float)(pIVar2->Count - column_index) *
                                        (pIVar5->Style).ColumnsMinSpacing)));
      auVar10 = ZEXT1664(auVar3);
    }
    if (column_index < 0) break;
    (pIVar2->Columns).Data[(uint)column_index].OffsetNorm =
         (auVar10._0_4_ - pIVar2->OffMinX) / (pIVar2->OffMaxX - pIVar2->OffMinX);
    if (!bVar4) {
      return;
    }
    column_index = column_index + 1;
    auVar12 = ZEXT416((uint)(pIVar5->Style).ColumnsMinSpacing);
    auVar3 = vcmpss_avx(auVar11,auVar12,2);
    auVar11 = vblendvps_avx(auVar11,auVar12,auVar3);
    auVar10 = ZEXT464((uint)(auVar10._0_4_ + auVar11._0_4_));
  }
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.h"
                ,0x66a,"T &ImVector<ImGuiOldColumnData>::operator[](int) [T = ImGuiOldColumnData]");
}

Assistant:

void ImGui::SetColumnOffset(int column_index, float offset)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiOldColumns* columns = window->DC.CurrentColumns;
    IM_ASSERT(columns != NULL);

    if (column_index < 0)
        column_index = columns->Current;
    IM_ASSERT(column_index < columns->Columns.Size);

    const bool preserve_width = !(columns->Flags & ImGuiOldColumnFlags_NoPreserveWidths) && (column_index < columns->Count - 1);
    const float width = preserve_width ? GetColumnWidthEx(columns, column_index, columns->IsBeingResized) : 0.0f;

    if (!(columns->Flags & ImGuiOldColumnFlags_NoForceWithinWindow))
        offset = ImMin(offset, columns->OffMaxX - g.Style.ColumnsMinSpacing * (columns->Count - column_index));
    columns->Columns[column_index].OffsetNorm = GetColumnNormFromOffset(columns, offset - columns->OffMinX);

    if (preserve_width)
        SetColumnOffset(column_index + 1, offset + ImMax(g.Style.ColumnsMinSpacing, width));
}